

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteInvalidModule
          (BinaryWriterSpec *this,ScriptModule *module,string_view text)

{
  ScriptModuleType SVar1;
  string_view __args;
  string_view __args_00;
  int iVar2;
  undefined4 extraout_var;
  TextScriptModule *pTVar3;
  Stream *pSVar4;
  DataScriptModule<(wabt::ScriptModuleType)1> *pDVar5;
  DataScriptModule<(wabt::ScriptModuleType)2> *pDVar6;
  size_type extraout_RDX;
  char *s;
  char *extension;
  string_view sVar7;
  string_view filename_00;
  string_view s_00;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  undefined1 local_58 [8];
  string filename;
  
  filename.field_2._8_8_ = text.size_;
  SVar1 = module->type_;
  if (SVar1 == Quoted) {
    s = "text";
    extension = kWatExtension;
  }
  else if ((SVar1 == Binary) || (SVar1 == Text)) {
    s = "binary";
    extension = kWasmExtension;
  }
  else {
    s = "";
    extension = "";
  }
  iVar2 = (*module->_vptr_ScriptModule[2])(module);
  WriteLocation(this,(Location *)CONCAT44(extraout_var,iVar2));
  WriteSeparator(this);
  (anonymous_namespace)::BinaryWriterSpec::GetModuleFilename_abi_cxx11_
            ((string *)local_58,this,extension);
  WriteKey(this,"filename");
  filename_00.size_ = extraout_RDX;
  filename_00.data_ = filename._M_dataplus._M_p;
  sVar7 = GetBasename((wabt *)local_58,filename_00);
  WriteEscapedString(this,sVar7);
  WriteSeparator(this);
  WriteKey(this,"text");
  s_00.size_ = filename.field_2._8_8_;
  s_00.data_ = text.data_;
  WriteEscapedString(this,s_00);
  WriteSeparator(this);
  WriteKey(this,"module_type");
  WriteString(this,s);
  __args_00.size_ = (size_type)filename._M_dataplus._M_p;
  __args_00.data_ = (char *)local_58;
  __args.size_ = (size_type)filename._M_dataplus._M_p;
  __args.data_ = (char *)local_58;
  sVar7.size_ = (size_type)filename._M_dataplus._M_p;
  sVar7.data_ = (char *)local_58;
  SVar1 = module->type_;
  if (SVar1 == Quoted) {
    pSVar4 = std::function<wabt::Stream_*(wabt::string_view)>::operator()
                       (&this->module_stream_factory_,__args_00);
    pDVar6 = cast<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,wabt::ScriptModule>(module);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70,&pDVar6->data);
    Stream::WriteData<unsigned_char>
              (pSVar4,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70,"",No);
  }
  else {
    if (SVar1 != Binary) {
      if (SVar1 == Text) {
        pTVar3 = cast<wabt::TextScriptModule,wabt::ScriptModule>(module);
        WriteModule(this,sVar7,&pTVar3->module);
      }
      goto LAB_00d90ddc;
    }
    pSVar4 = std::function<wabt::Stream_*(wabt::string_view)>::operator()
                       (&this->module_stream_factory_,__args);
    pDVar5 = cast<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,wabt::ScriptModule>(module);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70,&pDVar5->data);
    Stream::WriteData<unsigned_char>
              (pSVar4,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70,"",No);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_70);
LAB_00d90ddc:
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void BinaryWriterSpec::WriteInvalidModule(const ScriptModule& module,
                                          string_view text) {
  const char* extension = "";
  const char* module_type = "";
  switch (module.type()) {
    case ScriptModuleType::Text:
      extension = kWasmExtension;
      module_type = "binary";
      break;

    case ScriptModuleType::Binary:
      extension = kWasmExtension;
      module_type = "binary";
      break;

    case ScriptModuleType::Quoted:
      extension = kWatExtension;
      module_type = "text";
      break;
  }

  WriteLocation(module.location());
  WriteSeparator();
  std::string filename = GetModuleFilename(extension);
  WriteKey("filename");
  WriteEscapedString(GetBasename(filename));
  WriteSeparator();
  WriteKey("text");
  WriteEscapedString(text);
  WriteSeparator();
  WriteKey("module_type");
  WriteString(module_type);
  WriteScriptModule(filename, module);
}